

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  allocator<int> *this_00;
  allocator<tcu::Vector<float,_4>_> *this_01;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  GLuint GVar6;
  GLint GVar7;
  size_type sVar8;
  reference pvVar9;
  size_type sVar10;
  reference pvVar11;
  reference pixels;
  byte *pbVar12;
  reference pvVar13;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *extraout_RDX;
  Matrix<float,_4,_4> *extraout_RDX_00;
  Matrix<float,_4,_4> *mat_00;
  Matrix<float,_4,_4> *mat_01;
  CallLogWrapper *pCVar14;
  Vector<float,_4> local_3a0;
  ulong local_390;
  size_t i_5;
  vec4 epsilon;
  undefined8 local_370;
  int local_368;
  allocator<unsigned_char> local_361;
  int i_4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  undefined1 local_340 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_11;
  GLuint *data_10;
  Matrix<float,_4,_4> local_314;
  Matrix<float,_4,_4> local_2d4;
  Matrix<float,_4,_4> local_294;
  Vector<float,_3> local_254;
  Matrix<float,_4,_4> local_248;
  Matrix<float,_4,_4> local_208;
  tcu *local_1c8;
  mat4 *data_9;
  void *pvStack_1b8;
  int i_3;
  GLint *data_8;
  void *pvStack_1a8;
  GLuint i_2;
  GLuint *data_7;
  size_t i_1;
  int *data_6;
  long error;
  undefined1 local_180 [8];
  vector<int,_std::allocator<int>_> data_5;
  GLuint data_4 [4];
  allocator<tcu::Matrix<float,_4,_4>_> local_111;
  undefined1 local_110 [8];
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_3;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> data_2;
  GLuint data_1 [8];
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> data;
  GLfloat values [16];
  string local_40;
  int local_1c;
  AdvancedPipelineComputeChain *pAStack_18;
  int i;
  AdvancedPipelineComputeChain *this_local;
  
  pAStack_18 = this;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    glcts::(anonymous_namespace)::AdvancedPipelineComputeChain::GenGLSL_abi_cxx11_
              (&local_40,this,local_1c);
    GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
    this->m_program[local_1c] = GVar6;
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[local_1c]);
    if (local_1c == 0) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[0]);
      GVar7 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_program[local_1c],"g_add_value");
      glu::CallLogWrapper::glUniform1i
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar7,1);
      GVar7 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_program[local_1c],"g_counter_y");
      glu::CallLogWrapper::glUniform1ui
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar7,1);
      GVar7 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_program[local_1c],"g_image_value");
      glu::CallLogWrapper::glUniform4f
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar7,0.25,0.5,0.75,1.0);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    else if (local_1c == 1) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[1]);
      memcpy(&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,&DAT_02aa9d50,0x40);
      GVar7 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_program[local_1c],"g_mvp");
      glu::CallLogWrapper::glUniformMatrix4fv
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar7,1,'\0',
                 (GLfloat *)
                 &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    bVar5 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[local_1c],(bool *)0x0);
    if (!bVar5) {
      this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
  }
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,4,this->m_storage_buffer);
  std::allocator<int>::allocator((allocator<int> *)((long)data_1 + 0x1f));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b0,0x205,
             (allocator<int> *)((long)data_1 + 0x1f));
  std::allocator<int>::~allocator((allocator<int> *)((long)data_1 + 0x1f));
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,this->m_storage_buffer[0]);
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b0);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_b0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,sVar8 << 2,pvVar9,0x88e6);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  data_1[2] = 0;
  data_1[3] = 0;
  data_1[4] = 0;
  data_1[5] = 0;
  data_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data_1[0] = 0;
  data_1[1] = 0;
  pCVar14 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(pCVar14,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData
            (pCVar14,0x90d2,0x20,
             &data_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,0x88e6);
  data_3.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
  this_00 = (allocator<int> *)
            ((long)&data_3.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,0x200,
             (value_type_conflict1 *)
             ((long)&data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer[2]);
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_f0);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_f0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,sVar8 << 2,pvVar9,0x88e6);
  GVar6 = this->m_storage_buffer[2];
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_f0);
  glu::CallLogWrapper::glBindBufferRange
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,2,GVar6,0,sVar8 * 2 & 0x7ffffffffffffffe);
  GVar6 = this->m_storage_buffer[2];
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_f0);
  sVar10 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_f0);
  glu::CallLogWrapper::glBindBufferRange
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,3,GVar6,sVar8 * 2 & 0x7ffffffffffffffe,sVar10 * 2 & 0x7ffffffffffffffe);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
  std::allocator<tcu::Matrix<float,_4,_4>_>::allocator(&local_111);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
             local_110,2,&local_111);
  std::allocator<tcu::Matrix<float,_4,_4>_>::~allocator(&local_111);
  data_4[2] = 0x3f800000;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)(data_4 + 3),(float *)(data_4 + 2));
  pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
            operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        *)local_110,0);
  tcu::Matrix<float,_4,_4>::operator=(pvVar11,(Matrix<float,_4,_4> *)(data_4 + 3));
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(data_4 + 3));
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,4,this->m_storage_buffer[3]);
  sVar8 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::size
                    ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *
                     )local_110);
  pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
            operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        *)local_110,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,sVar8 << 6,pvVar11,0x88e6);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::~vector
            ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
             local_110);
  data_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data_4[0] = 0;
  data_4[1] = 0;
  pCVar14 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(pCVar14,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(pCVar14,0x92c0,0,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData
            (pCVar14,0x92c0,0x10,
             &data_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,0x88e6);
  error._4_4_ = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&error + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_180,0x40,
             (value_type_conflict1 *)((long)&error + 4),(allocator<int> *)((long)&error + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&error + 3));
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_texture);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,this->m_texture);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,1,0x8058,4,4);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_180,0);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0,0,4,4,0x1908,0x1401,pvVar9);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_180);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,this->m_texture,0,'\0',0,0x88ba,0x8058);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x2020);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,3,2,2);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,800);
  data_6 = (int *)0x0;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer[0]);
  i_1 = (size_t)glu::CallLogWrapper::glMapBufferRange
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x90d2,0,0x814,1);
  for (data_7 = (GLuint *)0x5; data_7 < (GLuint *)0x205; data_7 = (GLuint *)((long)data_7 + 1)) {
    if (*(int *)(i_1 + (long)data_7 * 4) != 4) {
      anon_unknown_0::Output
                ("Data is: %d should be: %d.\n",(ulong)*(uint *)(i_1 + (long)data_7 * 4),2);
      data_6 = (int *)&DAT_ffffffffffffffff;
    }
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer[1]);
  pvStack_1a8 = glu::CallLogWrapper::glMapBufferRange
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x90d2,0,0x20,1);
  for (data_8._4_4_ = 0; data_8._4_4_ < 4; data_8._4_4_ = data_8._4_4_ + 1) {
    if (*(uint *)((long)pvStack_1a8 + (ulong)data_8._4_4_ * 4) != data_8._4_4_) {
      anon_unknown_0::Output
                ("Data is: %d should be: %d.\n",
                 (ulong)*(uint *)((long)pvStack_1a8 + (ulong)data_8._4_4_ * 4),(ulong)data_8._4_4_);
      data_6 = (int *)&DAT_ffffffffffffffff;
    }
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer[2]);
  pvStack_1b8 = glu::CallLogWrapper::glMapBufferRange
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x90d2,0,0x800,1);
  for (data_9._4_4_ = 0; data_9._4_4_ < 2; data_9._4_4_ = data_9._4_4_ + 1) {
    if (*(int *)((long)pvStack_1b8 + (long)data_9._4_4_ * 4) != 5) {
      anon_unknown_0::Output
                ("Data is: %d should be: %d.\n",
                 (ulong)*(uint *)((long)pvStack_1b8 + (long)data_9._4_4_ * 4),5);
      data_6 = (int *)&DAT_ffffffffffffffff;
    }
    if (*(int *)((long)pvStack_1b8 + (long)(data_9._4_4_ + 0x100) * 4) != 7) {
      anon_unknown_0::Output
                ("Data is: %d should be: %d.\n",
                 (ulong)*(uint *)((long)pvStack_1b8 + (long)(data_9._4_4_ + 0x100) * 4),7);
      data_6 = (int *)&DAT_ffffffffffffffff;
    }
  }
  pCVar14 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUnmapBuffer(pCVar14,0x90d2);
  glu::CallLogWrapper::glBindBuffer(pCVar14,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(pCVar14,0x90d2,this->m_storage_buffer[3]);
  local_1c8 = (tcu *)glu::CallLogWrapper::glMapBufferRange(pCVar14,0x90d2,0,0x80,1);
  tcu::transpose<float,4,4>(&local_208,local_1c8 + 0x40,mat);
  tcu::Vector<float,_3>::Vector(&local_254,10.0,20.0,30.0);
  tcu::translationMatrix<float,_3>(&local_248,&local_254);
  bVar5 = tcu::operator!=(&local_208,&local_248);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_248);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_208);
  mat_00 = extraout_RDX;
  if (bVar5) {
    anon_unknown_0::Output("Data is incorrect.\n");
    data_6 = (int *)&DAT_ffffffffffffffff;
    mat_00 = extraout_RDX_00;
  }
  tcu::transpose<float,4,4>(&local_294,local_1c8,mat_00);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&data_10,10.0,20.0,30.0);
  tcu::translationMatrix<float,_3>(&local_314,(Vector<float,_3> *)&data_10);
  tcu::transpose<float,4,4>(&local_2d4,(tcu *)&local_314,mat_01);
  bVar5 = tcu::operator!=(&local_294,&local_2d4);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_2d4);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_314);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_294);
  if (bVar5) {
    anon_unknown_0::Output("Data is incorrect.\n");
    data_6 = (int *)&DAT_ffffffffffffffff;
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  data_11.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (pointer)glu::CallLogWrapper::glMapBufferRange
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x92c0,0,0x10,1);
  if ((data_11.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage)->m_data[3] != 5.60519e-45) {
    anon_unknown_0::Output
              ("Data is: %d should be: %d.\n",
               (ulong)(uint)(data_11.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data[3],4);
    data_6 = (int *)&DAT_ffffffffffffffff;
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x92c0);
  this_01 = (allocator<tcu::Vector<float,_4>_> *)
            ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(this_01);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_340,
             0x10,this_01);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,this->m_texture);
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x8d40,0x8ce0,0xde1,this->m_texture,0);
  std::allocator<unsigned_char>::allocator(&local_361);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4,0x40,&local_361);
  std::allocator<unsigned_char>::~allocator(&local_361);
  pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,0,4,4,0x1908,0x1401,pixels);
  for (local_368 = 0; local_368 < 0x40; local_368 = local_368 + 4) {
    pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4,
                         (long)local_368);
    bVar1 = *pbVar12;
    pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4,
                         (long)(local_368 + 1));
    bVar2 = *pbVar12;
    pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4,
                         (long)(local_368 + 2));
    bVar3 = *pbVar12;
    pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4,
                         (long)(local_368 + 3));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(epsilon.m_data + 2),(float)bVar1 / 255.0,(float)bVar2 / 255.0,
               (float)bVar3 / 255.0,(float)*pbVar12 / 255.0);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_340,(long)(local_368 / 4));
    *(undefined8 *)pvVar13->m_data = epsilon.m_data._8_8_;
    *(undefined8 *)(pvVar13->m_data + 2) = local_370;
  }
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&i_5,0.003921569,0.003921569,0.003921569,0.003921569);
  local_390 = 0;
  do {
    uVar4 = local_390;
    sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_340);
    if (sVar8 <= uVar4) {
      bVar5 = false;
LAB_0142028c:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_4);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_340
                );
      if (!bVar5) {
        this_local = (AdvancedPipelineComputeChain *)data_6;
      }
      return (long)this_local;
    }
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_340,local_390);
    tcu::Vector<float,_4>::Vector(&local_3a0,0.25,0.5,0.75,1.0);
    bVar5 = ComputeShaderBase::ColorEqual
                      (&this->super_ComputeShaderBase,pvVar13,&local_3a0,(vec4 *)&i_5);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      anon_unknown_0::Output("Invalid data at texture.\n");
      this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
      bVar5 = true;
      goto LAB_0142028c;
    }
    local_390 = local_390 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (i == 0)
			{
				glUseProgram(m_program[i]);
				glUniform1i(glGetUniformLocation(m_program[i], "g_add_value"), 1);
				glUniform1ui(glGetUniformLocation(m_program[i], "g_counter_y"), 1u);
				glUniform4f(glGetUniformLocation(m_program[i], "g_image_value"), 0.25f, 0.5f, 0.75f, 1.0f);
				glUseProgram(0);
			}
			else if (i == 1)
			{
				glUseProgram(m_program[i]);
				GLfloat values[16] = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f,  1.0f,  0.0f,  0.0f,
									   0.0f, 0.0f, 1.0f, 0.0f, 10.0f, 20.0f, 30.0f, 1.0f };
				glUniformMatrix4fv(glGetUniformLocation(m_program[i], "g_mvp"), 1, GL_FALSE, values);
				glUseProgram(0);
			}
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<GLint> data(4 * 4 * 4, 0);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 4, 4);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA8);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		long error = NO_ERROR;
		/* validate storage buffer 0 */
		{
			int* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			data = static_cast<int*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * (5 + 8 * 8 * 8), GL_MAP_READ_BIT));
			for (std::size_t i = 5; i < 5 + 8 * 8 * 8; ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 1 */
		{
			GLuint* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * 8, GL_MAP_READ_BIT));
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 2 & 3 */
		{
			GLint* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			data = static_cast<GLint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLint) * 512, GL_MAP_READ_BIT));
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					error = ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 4 */
		{
			mat4* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			data = static_cast<mat4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(mat4) * 2, GL_MAP_READ_BIT));
			if (transpose(data[1]) != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				error = ERROR;
			}
			if (transpose(data[0]) != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				error = ERROR;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate counter buffer */
		{
			GLuint* data;
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint) * 4, GL_MAP_READ_BIT));
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				error = ERROR;
			}
			glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		}
		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			vec4 epsilon = vec4(1.0f / 255.0f, 1.0f / 255.0f, 1.0f / 255.0f, 1.0f / 255.0f); // texture format is RGBA8.
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), epsilon))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}

		return error;
	}